

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void goodform::json::stringify_object(any *v,ostream *output)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  
  std::__ostream_insert<char,std::char_traits<char>>(output,"{",1);
  pmVar1 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                     (v);
  p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar1 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                     (v);
  if ((_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header) {
    do {
      pmVar1 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                         (v);
      if (p_Var2 != (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left) {
        std::__ostream_insert<char,std::char_traits<char>>(output,",",1);
      }
      write_string((string *)(p_Var2 + 1),output);
      std::__ostream_insert<char,std::char_traits<char>>(output,":",1);
      serialize((any *)(p_Var2 + 2),output);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      pmVar1 = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                         (v);
    } while ((_Rb_tree_header *)p_Var2 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header);
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,"}",1);
  return;
}

Assistant:

void json::stringify_object(const any& v, std::ostream& output)
  {
    output << "{";
    for (auto it = get<goodform::object_t>(v).begin(); it != get<goodform::object_t>(v).end(); ++it)
    {
      if (it != get<goodform::object_t>(v).begin())
        output << ",";
      write_string(it->first, output);
      output << ":";
      serialize(it->second, output);
    }
    output << "}";
  }